

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx512vbmi_harley_seal(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m512i c;
  __m512i c_00;
  __m512i c_01;
  __m512i c_02;
  __m512i c_03;
  __m512i c_04;
  __m512i c_05;
  __m512i c_06;
  __m512i c_07;
  __m512i c_08;
  __m512i c_09;
  __m512i c_10;
  __m512i c_11;
  __m512i c_12;
  __m512i c_13;
  __m512i b;
  __m512i b_00;
  __m512i b_01;
  __m512i b_02;
  __m512i b_03;
  __m512i b_04;
  __m512i b_05;
  __m512i b_06;
  __m512i b_07;
  __m512i b_08;
  __m512i b_09;
  __m512i b_10;
  __m512i b_11;
  __m512i b_12;
  __m512i b_13;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int j_4;
  size_t i_8;
  int j_3;
  size_t i_7;
  int j_2;
  size_t i_6;
  int j_1;
  size_t i_5;
  uint64_t buf64 [8];
  __m512i sum;
  __m512i sum_hi;
  __m512i sum_lo;
  __m512i hi_bytes;
  __m512i lo_bytes;
  __m512i shuffle_hi;
  __m512i shuffle_lo;
  size_t i_4;
  size_t i_3;
  size_t thislimit;
  size_t i_2;
  __m512i counter [16];
  uint64_t i;
  uint16_t buffer [32];
  uint64_t limit;
  size_t size;
  __m512i eightsB;
  __m512i eightsA;
  __m512i foursB;
  __m512i foursA;
  __m512i twosB;
  __m512i twosA;
  __m512i v16;
  __m512i v8;
  __m512i v4;
  __m512i v2;
  __m512i v1;
  __m512i *data;
  int j;
  uint32_t i_1;
  undefined8 in_stack_ffffffffffffc980;
  undefined1 *in_stack_ffffffffffffc988;
  undefined1 *puVar9;
  undefined1 *in_stack_ffffffffffffc998;
  undefined1 *puVar10;
  undefined1 *in_stack_ffffffffffffc9a8;
  undefined1 *in_stack_ffffffffffffc9b0;
  undefined1 *in_stack_ffffffffffffc9b8;
  undefined4 in_stack_ffffffffffffc9c0;
  undefined4 in_stack_ffffffffffffc9c4;
  undefined8 in_stack_ffffffffffffc9c8;
  undefined4 in_stack_ffffffffffffc9d0;
  undefined4 in_stack_ffffffffffffc9d4;
  undefined8 in_stack_ffffffffffffc9d8;
  undefined4 in_stack_ffffffffffffc9e0;
  undefined4 in_stack_ffffffffffffc9e4;
  undefined8 in_stack_ffffffffffffc9e8;
  ulong uVar11;
  undefined4 in_stack_ffffffffffffc9f0;
  undefined4 in_stack_ffffffffffffc9f4;
  int iVar12;
  ulong local_3608;
  undefined1 local_3600 [24];
  __m512i *in_stack_ffffffffffffca18;
  __m512i *in_stack_ffffffffffffca20;
  int iStack_35d8;
  int iStack_35d0;
  int iStack_35c8;
  ulong local_33e0;
  ulong local_33d8;
  ulong local_33d0;
  ulong local_33c8;
  undefined1 local_33c0 [64];
  undefined1 local_3380 [64];
  undefined1 local_3340 [64];
  undefined1 local_3300 [64];
  undefined1 local_32c0 [64];
  undefined1 local_3280 [64];
  undefined1 local_3240 [64];
  undefined1 local_3200 [64];
  undefined1 local_31c0 [64];
  undefined1 local_3180 [64];
  undefined1 local_3140 [64];
  undefined1 local_3100 [64];
  undefined1 local_30c0 [64];
  undefined1 local_3080 [64];
  undefined1 local_3040 [64];
  undefined1 local_3000 [64];
  ulong local_2f98;
  undefined1 local_2f90 [64];
  ulong local_2f50;
  ulong local_2f48;
  undefined1 local_2f40 [64];
  undefined1 local_2f00 [64];
  undefined1 local_2ec0 [64];
  undefined1 local_2e80 [64];
  undefined1 local_2e40 [64];
  undefined1 local_2e00 [64];
  undefined1 local_2dc0 [64];
  undefined1 local_2d80 [64];
  undefined1 local_2d40 [64];
  undefined1 local_2d00 [64];
  undefined1 local_2cc0 [64];
  long local_2c70;
  int local_2c68;
  uint local_2c64;
  long local_2c60;
  undefined1 (*local_2c48) [64];
  undefined1 (*local_2c40) [64];
  undefined1 (*local_2c38) [64];
  undefined1 (*local_2c30) [64];
  undefined1 (*local_2c28) [64];
  undefined1 (*local_2c20) [64];
  undefined1 (*local_2c18) [64];
  undefined1 (*local_2c10) [64];
  undefined1 (*local_2c08) [64];
  undefined1 (*local_2c00) [64];
  undefined1 (*local_2bf8) [64];
  undefined1 (*local_2bf0) [64];
  undefined1 (*local_2be8) [64];
  undefined1 (*local_2be0) [64];
  undefined1 (*local_2bd8) [64];
  undefined1 (*local_2bd0) [64];
  undefined4 local_2bc4;
  undefined1 local_2bc0 [64];
  undefined4 local_2b44;
  undefined1 local_2b40 [64];
  undefined4 local_2ac4;
  undefined1 local_2ac0 [64];
  undefined4 local_2a44;
  undefined1 local_2a40 [64];
  undefined4 local_29c4;
  undefined1 local_29c0 [64];
  undefined4 local_2944;
  undefined1 local_2940 [64];
  undefined4 local_28c4;
  undefined1 local_28c0 [64];
  undefined4 local_2844;
  undefined1 local_2840 [64];
  undefined4 local_27c4;
  undefined1 local_27c0 [64];
  undefined4 local_2744;
  undefined1 local_2740 [64];
  undefined4 local_26c4;
  undefined1 local_26c0 [64];
  undefined4 local_2644;
  undefined1 local_2640 [64];
  undefined4 local_25c4;
  undefined1 local_25c0 [64];
  undefined4 local_2544;
  undefined1 local_2540 [64];
  undefined4 local_24c4;
  undefined1 local_24c0 [64];
  undefined4 local_2444;
  undefined1 local_2440 [64];
  undefined4 local_23c4;
  undefined1 local_23c0 [64];
  undefined1 local_2380 [64];
  undefined1 local_2340 [64];
  undefined1 local_2300 [64];
  undefined1 local_22c0 [64];
  undefined1 local_2280 [64];
  undefined1 local_2240 [64];
  undefined1 local_2200 [64];
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined1 local_2100 [64];
  undefined1 local_20c0 [64];
  undefined1 local_2080 [64];
  undefined1 local_2040 [64];
  undefined1 local_2000 [64];
  undefined1 local_1fc0 [64];
  undefined1 local_1f80 [64];
  undefined1 local_1f40 [64];
  undefined1 local_1f00 [64];
  undefined1 local_1ec0 [64];
  undefined1 local_1e80 [64];
  undefined1 local_1e40 [64];
  undefined1 local_1e00 [64];
  undefined1 local_1dc0 [64];
  undefined1 local_1d80 [64];
  undefined1 local_1d40 [64];
  undefined1 local_1d00 [64];
  undefined1 local_1cc0 [64];
  undefined1 local_1c80 [64];
  undefined1 local_1c40 [64];
  undefined1 local_1c00 [64];
  undefined1 local_1bc0 [64];
  undefined1 local_1b80 [64];
  undefined1 local_1b40 [64];
  undefined1 local_1b00 [64];
  undefined2 local_1a82;
  undefined1 local_1a80 [64];
  undefined2 local_1a02;
  undefined1 local_1a00 [64];
  undefined2 local_1982;
  undefined1 local_1980 [64];
  undefined2 local_1902;
  undefined1 local_1900 [64];
  undefined2 local_1882;
  undefined1 local_1880 [64];
  undefined2 local_1802;
  undefined1 local_1800 [64];
  undefined2 local_1782;
  undefined1 local_1780 [64];
  undefined2 local_1702;
  undefined1 local_1700 [64];
  undefined2 local_1682;
  undefined1 local_1680 [64];
  undefined2 local_1602;
  undefined1 local_1600 [64];
  undefined2 local_1582;
  undefined1 local_1580 [64];
  undefined2 local_1502;
  undefined1 local_1500 [64];
  undefined2 local_1482;
  undefined1 local_1480 [64];
  undefined2 local_1402;
  undefined1 local_1400 [64];
  undefined2 local_1382;
  undefined1 local_1380 [64];
  undefined2 local_1302;
  undefined1 local_1300 [64];
  undefined2 local_1282;
  undefined1 local_1280 [64];
  undefined1 local_1240 [64];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [64];
  undefined1 local_1180 [64];
  undefined1 local_1140 [64];
  undefined1 local_1100 [64];
  undefined1 local_10c0 [64];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined1 local_f40 [64];
  undefined1 local_f00 [64];
  undefined1 local_ec0 [64];
  undefined1 local_e80 [64];
  undefined1 local_e40 [64];
  undefined1 local_e00 [64];
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined1 local_d40 [64];
  undefined1 local_d00 [64];
  undefined1 local_cc0 [64];
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_480 [64];
  undefined1 *local_408;
  undefined1 local_400 [64];
  undefined4 local_3c0;
  undefined4 local_3bc;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined4 local_384;
  undefined1 local_380 [64];
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined4 local_32c;
  undefined4 local_328;
  undefined4 local_324;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 local_308;
  undefined4 local_304;
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined4 local_144;
  undefined1 local_140 [64];
  undefined4 local_c4;
  undefined1 local_c0 [64];
  
  for (local_2c64 = in_ESI - (in_ESI & 0x1ff); local_2c64 < in_ESI; local_2c64 = local_2c64 + 1) {
    for (local_2c68 = 0; local_2c68 < 0x10; local_2c68 = local_2c68 + 1) {
      *(int *)(in_RDX + (long)local_2c68 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + (ulong)local_2c64 * 2) & 1 << ((byte)local_2c68 & 0x1f)
                 ) >> ((byte)local_2c68 & 0x1f)) + *(int *)(in_RDX + (long)local_2c68 * 4);
    }
  }
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  local_10c0 = vmovdqa64_avx512f(auVar6);
  auVar3 = vmovdqa64_avx512f(local_10c0);
  local_2cc0 = vmovdqa64_avx512f(auVar3);
  local_1100 = vmovdqa64_avx512f(auVar6);
  auVar3 = vmovdqa64_avx512f(local_1100);
  local_2d00 = vmovdqa64_avx512f(auVar3);
  local_1140 = vmovdqa64_avx512f(auVar6);
  auVar3 = vmovdqa64_avx512f(local_1140);
  local_2d40 = vmovdqa64_avx512f(auVar3);
  local_1180 = vmovdqa64_avx512f(auVar6);
  auVar3 = vmovdqa64_avx512f(local_1180);
  local_2d80 = vmovdqa64_avx512f(auVar3);
  local_11c0 = vmovdqa64_avx512f(auVar6);
  auVar3 = vmovdqa64_avx512f(local_11c0);
  local_2dc0 = vmovdqa64_avx512f(auVar3);
  local_2f48 = (ulong)(in_ESI >> 5);
  local_2f50 = local_2f48 - (local_2f48 & 0xf);
  local_2f98 = 0;
  local_2c70 = in_RDI;
  local_2c60 = in_RDX;
  while (local_2f98 < local_2f50) {
    for (local_33c8 = 0; local_33c8 < 0x10; local_33c8 = local_33c8 + 1) {
      local_1200 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar3 = vmovdqa64_avx512f(local_1200);
      auVar3 = vmovdqa64_avx512f(auVar3);
      *(undefined1 (*) [64])(local_33c0 + local_33c8 * 0x40) = auVar3;
    }
    local_33d0 = local_2f50;
    if (0xffff < local_2f50 - local_2f98) {
      local_33d0 = local_2f98 + 0xffff;
    }
    for (; local_2f98 < local_33d0; local_2f98 = local_2f98 + 0x10) {
      local_2bd0 = (undefined1 (*) [64])(local_2c70 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2bd0);
      local_2bd8 = (undefined1 (*) [64])(local_2c70 + 0x40 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2bd8);
      puVar9 = local_2e00;
      puVar10 = local_2cc0;
      b[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b[0] = (longlong)in_stack_ffffffffffffc9b8;
      b[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b[2] = in_stack_ffffffffffffc9c8;
      b[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b[4] = in_stack_ffffffffffffc9d8;
      b[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b[6] = in_stack_ffffffffffffc9e8;
      b[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c[1] = in_stack_ffffffffffffc980;
      c[0] = 0x151b16;
      c[2] = (longlong)in_stack_ffffffffffffc988;
      c[3] = (longlong)puVar9;
      c[4] = (longlong)in_stack_ffffffffffffc998;
      c[5] = (longlong)puVar10;
      c[6] = (longlong)in_stack_ffffffffffffc9a8;
      c[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b,c);
      local_2be0 = (undefined1 (*) [64])(local_2c70 + 0x80 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2be0);
      local_2be8 = (undefined1 (*) [64])(local_2c70 + 0xc0 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2be8);
      in_stack_ffffffffffffc998 = local_2e40;
      b_00[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_00[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_00[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_00[2] = in_stack_ffffffffffffc9c8;
      b_00[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_00[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_00[4] = in_stack_ffffffffffffc9d8;
      b_00[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_00[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_00[6] = in_stack_ffffffffffffc9e8;
      b_00[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_00[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_00[1] = in_stack_ffffffffffffc980;
      c_00[0] = 0x151b91;
      c_00[2] = (longlong)in_stack_ffffffffffffc988;
      c_00[3] = (longlong)puVar9;
      c_00[4] = (longlong)in_stack_ffffffffffffc998;
      c_00[5] = (longlong)puVar10;
      c_00[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_00[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_00,c_00);
      vmovdqa64_avx512f(local_2e00);
      vmovdqa64_avx512f(local_2e40);
      in_stack_ffffffffffffc988 = local_2e80;
      in_stack_ffffffffffffc9b0 = local_2d00;
      b_01[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_01[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_01[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_01[2] = in_stack_ffffffffffffc9c8;
      b_01[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_01[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_01[4] = in_stack_ffffffffffffc9d8;
      b_01[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_01[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_01[6] = in_stack_ffffffffffffc9e8;
      b_01[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_01[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_01[1] = in_stack_ffffffffffffc980;
      c_01[0] = 0x151bc0;
      c_01[2] = (longlong)in_stack_ffffffffffffc988;
      c_01[3] = (longlong)puVar9;
      c_01[4] = (longlong)in_stack_ffffffffffffc998;
      c_01[5] = (longlong)puVar10;
      c_01[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_01[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_01,c_01);
      local_2bf0 = (undefined1 (*) [64])(local_2c70 + 0x100 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2bf0);
      local_2bf8 = (undefined1 (*) [64])(local_2c70 + 0x140 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2bf8);
      b_02[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_02[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_02[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_02[2] = in_stack_ffffffffffffc9c8;
      b_02[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_02[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_02[4] = in_stack_ffffffffffffc9d8;
      b_02[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_02[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_02[6] = in_stack_ffffffffffffc9e8;
      b_02[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_02[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_02[1] = in_stack_ffffffffffffc980;
      c_02[0] = 0x151c33;
      c_02[2] = (longlong)in_stack_ffffffffffffc988;
      c_02[3] = (longlong)puVar9;
      c_02[4] = (longlong)in_stack_ffffffffffffc998;
      c_02[5] = (longlong)puVar10;
      c_02[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_02[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_02,c_02);
      local_2c00 = (undefined1 (*) [64])(local_2c70 + 0x180 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2c00);
      local_2c08 = (undefined1 (*) [64])(local_2c70 + 0x1c0 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2c08);
      b_03[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_03[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_03[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_03[2] = in_stack_ffffffffffffc9c8;
      b_03[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_03[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_03[4] = in_stack_ffffffffffffc9d8;
      b_03[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_03[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_03[6] = in_stack_ffffffffffffc9e8;
      b_03[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_03[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_03[1] = in_stack_ffffffffffffc980;
      c_03[0] = 0x151ca6;
      c_03[2] = (longlong)in_stack_ffffffffffffc988;
      c_03[3] = (longlong)puVar9;
      c_03[4] = (longlong)in_stack_ffffffffffffc998;
      c_03[5] = (longlong)puVar10;
      c_03[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_03[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_03,c_03);
      vmovdqa64_avx512f(local_2e00);
      vmovdqa64_avx512f(local_2e40);
      in_stack_ffffffffffffc9a8 = local_2ec0;
      b_04[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_04[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_04[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_04[2] = in_stack_ffffffffffffc9c8;
      b_04[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_04[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_04[4] = in_stack_ffffffffffffc9d8;
      b_04[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_04[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_04[6] = in_stack_ffffffffffffc9e8;
      b_04[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_04[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_04[1] = in_stack_ffffffffffffc980;
      c_04[0] = 0x151ccd;
      c_04[2] = (longlong)in_stack_ffffffffffffc988;
      c_04[3] = (longlong)puVar9;
      c_04[4] = (longlong)in_stack_ffffffffffffc998;
      c_04[5] = (longlong)puVar10;
      c_04[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_04[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_04,c_04);
      vmovdqa64_avx512f(local_2e80);
      vmovdqa64_avx512f(local_2ec0);
      in_stack_ffffffffffffc9b8 = local_2d40;
      b_05[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_05[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_05[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_05[2] = in_stack_ffffffffffffc9c8;
      b_05[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_05[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_05[4] = in_stack_ffffffffffffc9d8;
      b_05[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_05[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_05[6] = in_stack_ffffffffffffc9e8;
      b_05[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_05[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_05[1] = in_stack_ffffffffffffc980;
      c_05[0] = 0x151cf7;
      c_05[2] = (longlong)in_stack_ffffffffffffc988;
      c_05[3] = (longlong)puVar9;
      c_05[4] = (longlong)in_stack_ffffffffffffc998;
      c_05[5] = (longlong)puVar10;
      c_05[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_05[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_05,c_05);
      local_2c10 = (undefined1 (*) [64])(local_2c70 + 0x200 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2c10);
      local_2c18 = (undefined1 (*) [64])(local_2c70 + 0x240 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2c18);
      b_06[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_06[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_06[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_06[2] = in_stack_ffffffffffffc9c8;
      b_06[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_06[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_06[4] = in_stack_ffffffffffffc9d8;
      b_06[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_06[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_06[6] = in_stack_ffffffffffffc9e8;
      b_06[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_06[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_06[1] = in_stack_ffffffffffffc980;
      c_06[0] = 0x151d6a;
      c_06[2] = (longlong)in_stack_ffffffffffffc988;
      c_06[3] = (longlong)puVar9;
      c_06[4] = (longlong)in_stack_ffffffffffffc998;
      c_06[5] = (longlong)puVar10;
      c_06[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_06[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_06,c_06);
      local_2c20 = (undefined1 (*) [64])(local_2c70 + 0x280 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2c20);
      local_2c28 = (undefined1 (*) [64])(local_2c70 + 0x2c0 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2c28);
      b_07[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_07[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_07[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_07[2] = in_stack_ffffffffffffc9c8;
      b_07[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_07[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_07[4] = in_stack_ffffffffffffc9d8;
      b_07[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_07[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_07[6] = in_stack_ffffffffffffc9e8;
      b_07[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_07[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_07[1] = in_stack_ffffffffffffc980;
      c_07[0] = 0x151ddd;
      c_07[2] = (longlong)in_stack_ffffffffffffc988;
      c_07[3] = (longlong)puVar9;
      c_07[4] = (longlong)in_stack_ffffffffffffc998;
      c_07[5] = (longlong)puVar10;
      c_07[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_07[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_07,c_07);
      vmovdqa64_avx512f(local_2e00);
      vmovdqa64_avx512f(local_2e40);
      b_08[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_08[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_08[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_08[2] = in_stack_ffffffffffffc9c8;
      b_08[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_08[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_08[4] = in_stack_ffffffffffffc9d8;
      b_08[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_08[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_08[6] = in_stack_ffffffffffffc9e8;
      b_08[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_08[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_08[1] = in_stack_ffffffffffffc980;
      c_08[0] = 0x151dfc;
      c_08[2] = (longlong)in_stack_ffffffffffffc988;
      c_08[3] = (longlong)puVar9;
      c_08[4] = (longlong)in_stack_ffffffffffffc998;
      c_08[5] = (longlong)puVar10;
      c_08[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_08[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_08,c_08);
      local_2c30 = (undefined1 (*) [64])(local_2c70 + 0x300 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2c30);
      local_2c38 = (undefined1 (*) [64])(local_2c70 + 0x340 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2c38);
      b_09[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_09[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_09[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_09[2] = in_stack_ffffffffffffc9c8;
      b_09[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_09[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_09[4] = in_stack_ffffffffffffc9d8;
      b_09[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_09[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_09[6] = in_stack_ffffffffffffc9e8;
      b_09[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_09[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_09[1] = in_stack_ffffffffffffc980;
      c_09[0] = 0x151e6f;
      c_09[2] = (longlong)in_stack_ffffffffffffc988;
      c_09[3] = (longlong)puVar9;
      c_09[4] = (longlong)in_stack_ffffffffffffc998;
      c_09[5] = (longlong)puVar10;
      c_09[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_09[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_09,c_09);
      local_2c40 = (undefined1 (*) [64])(local_2c70 + 0x380 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2c40);
      local_2c48 = (undefined1 (*) [64])(local_2c70 + 0x3c0 + local_2f98 * 0x40);
      vmovdqu64_avx512f(*local_2c48);
      b_10[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_10[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_10[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_10[2] = in_stack_ffffffffffffc9c8;
      b_10[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_10[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_10[4] = in_stack_ffffffffffffc9d8;
      b_10[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_10[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_10[6] = in_stack_ffffffffffffc9e8;
      b_10[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_10[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_10[1] = in_stack_ffffffffffffc980;
      c_10[0] = 0x151ee2;
      c_10[2] = (longlong)in_stack_ffffffffffffc988;
      c_10[3] = (longlong)puVar9;
      c_10[4] = (longlong)in_stack_ffffffffffffc998;
      c_10[5] = (longlong)puVar10;
      c_10[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_10[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_10,c_10);
      vmovdqa64_avx512f(local_2e00);
      vmovdqa64_avx512f(local_2e40);
      b_11[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_11[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_11[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_11[2] = in_stack_ffffffffffffc9c8;
      b_11[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_11[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_11[4] = in_stack_ffffffffffffc9d8;
      b_11[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_11[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_11[6] = in_stack_ffffffffffffc9e8;
      b_11[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_11[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_11[1] = in_stack_ffffffffffffc980;
      c_11[0] = 0x151f01;
      c_11[2] = (longlong)in_stack_ffffffffffffc988;
      c_11[3] = (longlong)puVar9;
      c_11[4] = (longlong)in_stack_ffffffffffffc998;
      c_11[5] = (longlong)puVar10;
      c_11[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_11[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_11,c_11);
      vmovdqa64_avx512f(local_2e80);
      vmovdqa64_avx512f(local_2ec0);
      b_12[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_12[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_12[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_12[2] = in_stack_ffffffffffffc9c8;
      b_12[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_12[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_12[4] = in_stack_ffffffffffffc9d8;
      b_12[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_12[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_12[6] = in_stack_ffffffffffffc9e8;
      b_12[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_12[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_12[1] = in_stack_ffffffffffffc980;
      c_12[0] = 0x151f23;
      c_12[2] = (longlong)in_stack_ffffffffffffc988;
      c_12[3] = (longlong)puVar9;
      c_12[4] = (longlong)in_stack_ffffffffffffc998;
      c_12[5] = (longlong)puVar10;
      c_12[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_12[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_12,c_12);
      auVar3 = vmovdqa64_avx512f(local_33c0);
      auVar6 = vmovdqa64_avx512f(local_2dc0);
      local_1282 = 1;
      auVar4 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1300 = vmovdqa64_avx512f(auVar4);
      auVar4 = vmovdqa64_avx512f(local_1300);
      local_1b40 = vmovdqa64_avx512f(auVar6);
      local_1b80 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_1b40);
      auVar4 = vmovdqa64_avx512f(local_1b80);
      auVar6 = vpandq_avx512f(auVar6,auVar4);
      local_6c0 = vmovdqa64_avx512f(auVar3);
      local_700 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(local_6c0);
      auVar6 = vmovdqa64_avx512f(local_700);
      auVar3 = vpaddw_avx512bw(auVar3,auVar6);
      local_33c0 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_2dc0);
      local_23c0 = vmovdqa64_avx512f(auVar3);
      local_23c4 = 1;
      auVar3 = vmovdqa64_avx512f(local_23c0);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_3380);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1302 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1380 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1380);
      local_1bc0 = vmovdqa64_avx512f(auVar4);
      local_1c00 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_1bc0);
      auVar5 = vmovdqa64_avx512f(local_1c00);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_740 = vmovdqa64_avx512f(auVar6);
      local_780 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_740);
      auVar4 = vmovdqa64_avx512f(local_780);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_3380 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_2440 = vmovdqa64_avx512f(auVar3);
      local_2444 = 1;
      auVar3 = vmovdqa64_avx512f(local_2440);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_3340);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1382 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1400 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1400);
      local_1c40 = vmovdqa64_avx512f(auVar4);
      local_1c80 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_1c40);
      auVar5 = vmovdqa64_avx512f(local_1c80);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_7c0 = vmovdqa64_avx512f(auVar6);
      local_800 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_7c0);
      auVar4 = vmovdqa64_avx512f(local_800);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_3340 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_24c0 = vmovdqa64_avx512f(auVar3);
      local_24c4 = 1;
      auVar3 = vmovdqa64_avx512f(local_24c0);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_3300);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1402 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1480 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1480);
      local_1cc0 = vmovdqa64_avx512f(auVar4);
      local_1d00 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_1cc0);
      auVar5 = vmovdqa64_avx512f(local_1d00);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_840 = vmovdqa64_avx512f(auVar6);
      local_880 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_840);
      auVar4 = vmovdqa64_avx512f(local_880);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_3300 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_2540 = vmovdqa64_avx512f(auVar3);
      local_2544 = 1;
      auVar3 = vmovdqa64_avx512f(local_2540);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_32c0);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1482 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1500 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1500);
      local_1d40 = vmovdqa64_avx512f(auVar4);
      local_1d80 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_1d40);
      auVar5 = vmovdqa64_avx512f(local_1d80);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_8c0 = vmovdqa64_avx512f(auVar6);
      local_900 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_8c0);
      auVar4 = vmovdqa64_avx512f(local_900);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_32c0 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_25c0 = vmovdqa64_avx512f(auVar3);
      local_25c4 = 1;
      auVar3 = vmovdqa64_avx512f(local_25c0);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_3280);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1502 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1580 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1580);
      local_1dc0 = vmovdqa64_avx512f(auVar4);
      local_1e00 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_1dc0);
      auVar5 = vmovdqa64_avx512f(local_1e00);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_940 = vmovdqa64_avx512f(auVar6);
      local_980 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_940);
      auVar4 = vmovdqa64_avx512f(local_980);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_3280 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_2640 = vmovdqa64_avx512f(auVar3);
      local_2644 = 1;
      auVar3 = vmovdqa64_avx512f(local_2640);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_3240);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1582 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1600 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1600);
      local_1e40 = vmovdqa64_avx512f(auVar4);
      local_1e80 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_1e40);
      auVar5 = vmovdqa64_avx512f(local_1e80);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_9c0 = vmovdqa64_avx512f(auVar6);
      local_a00 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_9c0);
      auVar4 = vmovdqa64_avx512f(local_a00);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_3240 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_26c0 = vmovdqa64_avx512f(auVar3);
      local_26c4 = 1;
      auVar3 = vmovdqa64_avx512f(local_26c0);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_3200);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1602 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1680 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1680);
      local_1ec0 = vmovdqa64_avx512f(auVar4);
      local_1f00 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_1ec0);
      auVar5 = vmovdqa64_avx512f(local_1f00);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_a40 = vmovdqa64_avx512f(auVar6);
      local_a80 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_a40);
      auVar4 = vmovdqa64_avx512f(local_a80);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_3200 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_2740 = vmovdqa64_avx512f(auVar3);
      local_2744 = 1;
      auVar3 = vmovdqa64_avx512f(local_2740);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_31c0);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1682 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1700 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1700);
      local_1f40 = vmovdqa64_avx512f(auVar4);
      local_1f80 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_1f40);
      auVar5 = vmovdqa64_avx512f(local_1f80);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_ac0 = vmovdqa64_avx512f(auVar6);
      local_b00 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_ac0);
      auVar4 = vmovdqa64_avx512f(local_b00);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_31c0 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_27c0 = vmovdqa64_avx512f(auVar3);
      local_27c4 = 1;
      auVar3 = vmovdqa64_avx512f(local_27c0);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_3180);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1702 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1780 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1780);
      local_1fc0 = vmovdqa64_avx512f(auVar4);
      local_2000 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_1fc0);
      auVar5 = vmovdqa64_avx512f(local_2000);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_b40 = vmovdqa64_avx512f(auVar6);
      local_b80 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_b40);
      auVar4 = vmovdqa64_avx512f(local_b80);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_3180 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_2840 = vmovdqa64_avx512f(auVar3);
      local_2844 = 1;
      auVar3 = vmovdqa64_avx512f(local_2840);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_3140);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1782 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1800 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1800);
      local_2040 = vmovdqa64_avx512f(auVar4);
      local_2080 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_2040);
      auVar5 = vmovdqa64_avx512f(local_2080);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_bc0 = vmovdqa64_avx512f(auVar6);
      local_c00 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_bc0);
      auVar4 = vmovdqa64_avx512f(local_c00);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_3140 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_28c0 = vmovdqa64_avx512f(auVar3);
      local_28c4 = 1;
      auVar3 = vmovdqa64_avx512f(local_28c0);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_3100);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1802 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1880 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1880);
      local_20c0 = vmovdqa64_avx512f(auVar4);
      local_2100 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_20c0);
      auVar5 = vmovdqa64_avx512f(local_2100);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_c40 = vmovdqa64_avx512f(auVar6);
      local_c80 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_c40);
      auVar4 = vmovdqa64_avx512f(local_c80);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_3100 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_2940 = vmovdqa64_avx512f(auVar3);
      local_2944 = 1;
      auVar3 = vmovdqa64_avx512f(local_2940);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_30c0);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1882 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1900 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1900);
      local_2140 = vmovdqa64_avx512f(auVar4);
      local_2180 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_2140);
      auVar5 = vmovdqa64_avx512f(local_2180);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_cc0 = vmovdqa64_avx512f(auVar6);
      local_d00 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_cc0);
      auVar4 = vmovdqa64_avx512f(local_d00);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_30c0 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_29c0 = vmovdqa64_avx512f(auVar3);
      local_29c4 = 1;
      auVar3 = vmovdqa64_avx512f(local_29c0);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_3080);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1902 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1980 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1980);
      local_21c0 = vmovdqa64_avx512f(auVar4);
      local_2200 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_21c0);
      auVar5 = vmovdqa64_avx512f(local_2200);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_d40 = vmovdqa64_avx512f(auVar6);
      local_d80 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_d40);
      auVar4 = vmovdqa64_avx512f(local_d80);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_3080 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_2a40 = vmovdqa64_avx512f(auVar3);
      local_2a44 = 1;
      auVar3 = vmovdqa64_avx512f(local_2a40);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_3040);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1982 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1a00 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1a00);
      local_2240 = vmovdqa64_avx512f(auVar4);
      local_2280 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_2240);
      auVar5 = vmovdqa64_avx512f(local_2280);
      auVar4 = vpandq_avx512f(auVar4,auVar5);
      local_dc0 = vmovdqa64_avx512f(auVar6);
      local_e00 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_dc0);
      auVar4 = vmovdqa64_avx512f(local_e00);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_3040 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_2ac0 = vmovdqa64_avx512f(auVar3);
      local_2ac4 = 1;
      auVar3 = vmovdqa64_avx512f(local_2ac0);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(local_3000);
      auVar4 = vmovdqa64_avx512f(auVar3);
      local_1a02 = 1;
      auVar5 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1a80 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_1a80);
      local_22c0 = vmovdqa64_avx512f(auVar4);
      local_2300 = vmovdqa64_avx512f(auVar5);
      auVar4 = vmovdqa64_avx512f(local_22c0);
      auVar4 = vpandq_avx512f(auVar4,local_2300);
      local_e40 = vmovdqa64_avx512f(auVar6);
      local_e80 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_e40);
      auVar4 = vmovdqa64_avx512f(local_e80);
      auVar6 = vpaddw_avx512bw(auVar6,auVar4);
      local_3000 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_2b40 = vmovdqa64_avx512f(auVar3);
      local_2b44 = 1;
      auVar3 = vmovdqa64_avx512f(local_2b40);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      local_2dc0 = vmovdqa64_avx512f(auVar3);
      vmovdqa64_avx512f(local_2f00);
      vmovdqa64_avx512f(local_2f40);
      b_13[1]._0_4_ = in_stack_ffffffffffffc9c0;
      b_13[0] = (longlong)in_stack_ffffffffffffc9b8;
      b_13[1]._4_4_ = in_stack_ffffffffffffc9c4;
      b_13[2] = in_stack_ffffffffffffc9c8;
      b_13[3]._0_4_ = in_stack_ffffffffffffc9d0;
      b_13[3]._4_4_ = in_stack_ffffffffffffc9d4;
      b_13[4] = in_stack_ffffffffffffc9d8;
      b_13[5]._0_4_ = in_stack_ffffffffffffc9e0;
      b_13[5]._4_4_ = in_stack_ffffffffffffc9e4;
      b_13[6] = in_stack_ffffffffffffc9e8;
      b_13[7]._0_4_ = in_stack_ffffffffffffc9f0;
      b_13[7]._4_4_ = in_stack_ffffffffffffc9f4;
      c_13[1] = in_stack_ffffffffffffc980;
      c_13[0] = 0x152c64;
      c_13[2] = (longlong)in_stack_ffffffffffffc988;
      c_13[3] = (longlong)puVar9;
      c_13[4] = (longlong)in_stack_ffffffffffffc998;
      c_13[5] = (longlong)puVar10;
      c_13[6] = (longlong)in_stack_ffffffffffffc9a8;
      c_13[7] = (longlong)in_stack_ffffffffffffc9b0;
      pospopcnt_csa_avx512(in_stack_ffffffffffffca20,in_stack_ffffffffffffca18,b_13,c_13);
    }
    for (local_33d8 = 0; local_33d8 < 0x10; local_33d8 = local_33d8 + 1) {
      auVar3 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_33c0 + local_33d8 * 0x40));
      auVar6 = vmovdqa64_avx512f(local_2dc0);
      local_1a82 = 1;
      auVar4 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1b00 = vmovdqa64_avx512f(auVar4);
      auVar4 = vmovdqa64_avx512f(local_1b00);
      local_2340 = vmovdqa64_avx512f(auVar6);
      local_2380 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_2340);
      auVar6 = vpandq_avx512f(auVar6,local_2380);
      local_ec0 = vmovdqa64_avx512f(auVar3);
      local_f00 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(local_ec0);
      auVar6 = vmovdqa64_avx512f(local_f00);
      auVar3 = vpaddw_avx512bw(auVar3,auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      *(undefined1 (*) [64])(local_33c0 + local_33d8 * 0x40) = auVar3;
      auVar3 = vmovdqa64_avx512f(local_2dc0);
      local_2bc0 = vmovdqa64_avx512f(auVar3);
      local_2bc4 = 1;
      auVar3 = vmovdqa64_avx512f(local_2bc0);
      auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(1));
      local_2dc0 = vmovdqa64_avx512f(auVar3);
    }
    for (local_33e0 = 0; local_33e0 < 0x10; local_33e0 = local_33e0 + 2) {
      local_304 = 0x7e7c7a78;
      local_308 = 0x76747270;
      local_30c = 0x6e6c6a68;
      local_310 = 0x66646260;
      local_314 = 0x5e5c5a58;
      local_318 = 0x56545250;
      local_31c = 0x4e4c4a48;
      local_320 = 0x46444240;
      local_324 = 0x3e3c3a38;
      local_328 = 0x36343230;
      local_32c = 0x2e2c2a28;
      local_330 = 0x26242220;
      local_334 = 0x1e1c1a18;
      local_338 = 0x16141210;
      local_33c = 0xe0c0a08;
      local_340 = 0x6040200;
      auVar1 = vpinsrd_avx(ZEXT416(0x66646260),0x6e6c6a68,1);
      auVar1 = vpinsrd_avx(auVar1,0x76747270,2);
      auVar1 = vpinsrd_avx(auVar1,0x7e7c7a78,3);
      auVar2 = vpinsrd_avx(ZEXT416(0x46444240),0x4e4c4a48,1);
      auVar2 = vpinsrd_avx(auVar2,0x56545250,2);
      auVar2 = vpinsrd_avx(auVar2,0x5e5c5a58,3);
      auVar7._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar7._16_16_ = ZEXT116(1) * auVar1;
      auVar1 = vpinsrd_avx(ZEXT416(0x26242220),0x2e2c2a28,1);
      auVar1 = vpinsrd_avx(auVar1,0x36343230,2);
      auVar1 = vpinsrd_avx(auVar1,0x3e3c3a38,3);
      auVar2 = vpinsrd_avx(ZEXT416(0x6040200),0xe0c0a08,1);
      auVar2 = vpinsrd_avx(auVar2,0x16141210,2);
      auVar2 = vpinsrd_avx(auVar2,0x1e1c1a18,3);
      auVar3 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar1,
                                              ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2)),auVar7,1);
      local_380 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_380);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_384 = 0x7f7d7b79;
      local_388 = 0x77757371;
      local_38c = 0x6f6d6b69;
      local_390 = 0x67656361;
      local_394 = 0x5f5d5b59;
      local_398 = 0x57555351;
      local_39c = 0x4f4d4b49;
      local_3a0 = 0x47454341;
      local_3a4 = 0x3f3d3b39;
      local_3a8 = 0x37353331;
      local_3ac = 0x2f2d2b29;
      local_3b0 = 0x27252321;
      local_3b4 = 0x1f1d1b19;
      local_3b8 = 0x17151311;
      local_3bc = 0xf0d0b09;
      local_3c0 = 0x7050301;
      auVar1 = vpinsrd_avx(ZEXT416(0x67656361),0x6f6d6b69,1);
      auVar1 = vpinsrd_avx(auVar1,0x77757371,2);
      auVar1 = vpinsrd_avx(auVar1,0x7f7d7b79,3);
      auVar2 = vpinsrd_avx(ZEXT416(0x47454341),0x4f4d4b49,1);
      auVar2 = vpinsrd_avx(auVar2,0x57555351,2);
      auVar2 = vpinsrd_avx(auVar2,0x5f5d5b59,3);
      auVar8._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar8._16_16_ = ZEXT116(1) * auVar1;
      auVar1 = vpinsrd_avx(ZEXT416(0x27252321),0x2f2d2b29,1);
      auVar1 = vpinsrd_avx(auVar1,0x37353331,2);
      auVar1 = vpinsrd_avx(auVar1,0x3f3d3b39,3);
      auVar2 = vpinsrd_avx(ZEXT416(0x7050301),0xf0d0b09,1);
      auVar2 = vpinsrd_avx(auVar2,0x17151311,2);
      auVar2 = vpinsrd_avx(auVar2,0x1f1d1b19,3);
      auVar6 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar1,
                                              ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2)),auVar8,1);
      local_400 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(local_400);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_33c0 + local_33e0 * 0x40));
      auVar5 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_3380 + local_33e0 * 0x40));
      local_1c0 = vmovdqa64_avx512f(auVar4);
      local_200 = vmovdqa64_avx512f(auVar3);
      local_240 = vmovdqa64_avx512f(auVar5);
      auVar3 = vmovdqa64_avx512f(local_1c0);
      auVar4 = vmovdqa64_avx512f(local_200);
      auVar5 = vmovdqa64_avx512f(local_240);
      auVar3 = vpermt2b_avx512_vbmi(auVar3,auVar4,auVar5);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar4 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_33c0 + local_33e0 * 0x40));
      auVar5 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_3380 + local_33e0 * 0x40));
      local_280 = vmovdqa64_avx512f(auVar4);
      local_2c0 = vmovdqa64_avx512f(auVar6);
      local_300 = vmovdqa64_avx512f(auVar5);
      auVar6 = vmovdqa64_avx512f(local_280);
      auVar4 = vmovdqa64_avx512f(local_2c0);
      auVar5 = vmovdqa64_avx512f(local_300);
      auVar6 = vpermt2b_avx512_vbmi(auVar6,auVar4,auVar5);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_1240 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar4 = vmovdqa64_avx512f(local_1240);
      local_f40 = vmovdqa64_avx512f(auVar3);
      local_f80 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(local_f40);
      auVar4 = vmovdqa64_avx512f(local_f80);
      auVar3 = vpsadbw_avx512bw(auVar3,auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(auVar6);
      local_1280 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar4 = vmovdqa64_avx512f(local_1280);
      local_fc0 = vmovdqa64_avx512f(auVar6);
      local_1000 = vmovdqa64_avx512f(auVar4);
      auVar6 = vmovdqa64_avx512f(local_fc0);
      auVar4 = vmovdqa64_avx512f(local_1000);
      auVar6 = vpsadbw_avx512bw(auVar6,auVar4);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar6 = vmovdqa64_avx512f(auVar6);
      local_140 = vmovdqa64_avx512f(auVar6);
      local_144 = 8;
      auVar6 = vmovdqa64_avx512f(local_140);
      auVar6 = vpsllq_avx512f(auVar6,ZEXT416(8));
      local_1040 = vmovdqa64_avx512f(auVar3);
      local_1080 = vmovdqa64_avx512f(auVar6);
      auVar3 = vmovdqa64_avx512f(local_1040);
      auVar3 = vpaddq_avx512f(auVar3,local_1080);
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_408 = local_3600;
      auVar3 = vmovdqa64_avx512f(auVar3);
      local_c0 = vmovdqa64_avx512f(auVar3);
      local_c4 = 4;
      auVar3 = vmovdqa64_avx512f(local_c0);
      auVar3 = vpslld_avx512f(auVar3,ZEXT416(4));
      local_480 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_480);
      auVar3 = vmovdqu64_avx512f(auVar3);
      in_stack_ffffffffffffca20 = auVar3._32_8_;
      in_stack_ffffffffffffca18 = auVar3._24_8_;
      *(int *)(local_2c60 + local_33e0 * 4) =
           *(int *)(local_2c60 + local_33e0 * 4) +
           auVar3._0_4_ + auVar3._8_4_ + auVar3._16_4_ + auVar3._24_4_;
      *(int *)(local_2c60 + 4 + local_33e0 * 4) =
           *(int *)(local_2c60 + 4 + local_33e0 * 4) +
           auVar3._32_4_ + iStack_35d8 + iStack_35d0 + iStack_35c8;
    }
  }
  auVar3 = vmovdqa64_avx512f(local_2cc0);
  auVar3 = vmovdqa64_avx512f(auVar3);
  auVar3 = vmovdqa64_avx512f(auVar3);
  local_2f90 = vmovdqu64_avx512f(auVar3);
  for (local_3608 = 0; local_3608 < 0x20; local_3608 = local_3608 + 1) {
    for (iVar12 = 0; iVar12 < 0x10; iVar12 = iVar12 + 1) {
      *(int *)(local_2c60 + (long)iVar12 * 4) =
           ((int)((uint)*(ushort *)(local_2f90 + local_3608 * 2) & 1 << ((byte)iVar12 & 0x1f)) >>
           ((byte)iVar12 & 0x1f)) + *(int *)(local_2c60 + (long)iVar12 * 4);
    }
  }
  auVar3 = vmovdqa64_avx512f(local_2d00);
  auVar3 = vmovdqa64_avx512f(auVar3);
  auVar3 = vmovdqa64_avx512f(auVar3);
  local_2f90 = vmovdqu64_avx512f(auVar3);
  for (uVar11 = 0; uVar11 < 0x20; uVar11 = uVar11 + 1) {
    for (iVar12 = 0; iVar12 < 0x10; iVar12 = iVar12 + 1) {
      *(int *)(local_2c60 + (long)iVar12 * 4) =
           ((int)((uint)*(ushort *)(local_2f90 + uVar11 * 2) & 1 << ((byte)iVar12 & 0x1f)) >>
           ((byte)iVar12 & 0x1f)) * 2 + *(int *)(local_2c60 + (long)iVar12 * 4);
    }
  }
  auVar3 = vmovdqa64_avx512f(local_2d40);
  auVar3 = vmovdqa64_avx512f(auVar3);
  auVar3 = vmovdqa64_avx512f(auVar3);
  local_2f90 = vmovdqu64_avx512f(auVar3);
  for (uVar11 = 0; uVar11 < 0x20; uVar11 = uVar11 + 1) {
    for (iVar12 = 0; iVar12 < 0x10; iVar12 = iVar12 + 1) {
      *(int *)(local_2c60 + (long)iVar12 * 4) =
           ((int)((uint)*(ushort *)(local_2f90 + uVar11 * 2) & 1 << ((byte)iVar12 & 0x1f)) >>
           ((byte)iVar12 & 0x1f)) * 4 + *(int *)(local_2c60 + (long)iVar12 * 4);
    }
  }
  auVar3 = vmovdqa64_avx512f(local_2d80);
  auVar3 = vmovdqa64_avx512f(auVar3);
  auVar3 = vmovdqa64_avx512f(auVar3);
  local_2f90 = vmovdqu64_avx512f(auVar3);
  for (uVar11 = 0; uVar11 < 0x20; uVar11 = uVar11 + 1) {
    for (iVar12 = 0; iVar12 < 0x10; iVar12 = iVar12 + 1) {
      *(int *)(local_2c60 + (long)iVar12 * 4) =
           ((int)((uint)*(ushort *)(local_2f90 + uVar11 * 2) & 1 << ((byte)iVar12 & 0x1f)) >>
           ((byte)iVar12 & 0x1f)) * 8 + *(int *)(local_2c60 + (long)iVar12 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512vbmi_harley_seal(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (32 * 16)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m512i* data = (const __m512i*)array;
    __m512i v1  = _mm512_setzero_si512();
    __m512i v2  = _mm512_setzero_si512();
    __m512i v4  = _mm512_setzero_si512();
    __m512i v8  = _mm512_setzero_si512();
    __m512i v16 = _mm512_setzero_si512();
    __m512i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const size_t size = len / 32;
    const uint64_t limit = size - size % 16;

    uint16_t buffer[32];

    uint64_t i = 0;
    while (i < limit) {
        __m512i counter[16];
        for (size_t i = 0; i < 16; ++i) {
            counter[i] = _mm512_setzero_si512();
        }

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define U(pos) {                     \
    counter[pos] = _mm512_add_epi16(counter[pos], _mm512_and_si512(v16, _mm512_set1_epi16(1))); \
    v16 = _mm512_srli_epi16(v16, 1); \
}
            pospopcnt_csa_avx512(&twosA,  &v1, _mm512_loadu_si512(data + i + 0), _mm512_loadu_si512(data + i + 1));
            pospopcnt_csa_avx512(&twosB,  &v1, _mm512_loadu_si512(data + i + 2), _mm512_loadu_si512(data + i + 3));
            pospopcnt_csa_avx512(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_avx512(&twosA,  &v1, _mm512_loadu_si512(data + i + 4), _mm512_loadu_si512(data + i + 5));
            pospopcnt_csa_avx512(&twosB,  &v1, _mm512_loadu_si512(data + i + 6), _mm512_loadu_si512(data + i + 7));
            pospopcnt_csa_avx512(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_avx512(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_avx512(&twosA,  &v1, _mm512_loadu_si512(data + i + 8),  _mm512_loadu_si512(data + i + 9));
            pospopcnt_csa_avx512(&twosB,  &v1, _mm512_loadu_si512(data + i + 10), _mm512_loadu_si512(data + i + 11));
            pospopcnt_csa_avx512(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_avx512(&twosA,  &v1, _mm512_loadu_si512(data + i + 12), _mm512_loadu_si512(data + i + 13));
            pospopcnt_csa_avx512(&twosB,  &v1, _mm512_loadu_si512(data + i + 14), _mm512_loadu_si512(data + i + 15));
            pospopcnt_csa_avx512(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_avx512(&eightsB,&v4, foursA, foursB);
            U(0) U(1) U(2) U(3) U(4) U(5) U(6) U(7) U(8) U(9) U(10) U(11) U(12) U(13) U(14) U(15) // Updates
            pospopcnt_csa_avx512(&v16,    &v8, eightsA, eightsB);
        }

        // Update the counters after the last iteration
        for (size_t i = 0; i < 16; ++i) U(i)
#undef U
        
        for (size_t i = 0; i < 16; i += 2) {
// 00000110 00000100 00000010 00000000, 00001110 00001100 00001010 00001000, 00010110 00010100 00010010 00010000, 00011110 00011100 00011010 00011000
// {6, 4, 2, 0},                        {14, 12, 10, 8},                     {22, 20, 18, 16},                    {30, 28, 26, 24}
// 00100110 00100100 00100010 00100000, 00101110 00101100 00101010 00101000, 00110110 00110100 00110010 00110000, 00111110 00111100 00111010 00111000
// {38, 36, 34, 32},                    {46, 44, 42, 40},                    {54, 52, 50, 48},                    {62, 60, 58, 56}
// 01000110 01000100 01000010 01000000, 01001110 01001100 01001010 01001000, 01010110 01010100 01010010 01010000, 01011110 01011100 01011010 01011000
// {70, 68, 66, 64},                    {78, 76, 74, 72},                    {86, 84, 82, 80},                    {94, 92, 90, 88}
// 01100110 01100100 01100010 01100000, 01101110 01101100 01101010 01101000, 01110110 01110100 01110010 01110000, 01111110 01111100 01111010 01111000
// {102, 100, 98, 96},                  {110, 108, 106, 104},                {118, 116, 114, 112},                {126, 124, 122, 120}
            __m512i shuffle_lo = _mm512_setr_epi32(0x06040200, 0x0e0c0a08, 0x16141210, 0x1e1c1a18,
                                                   0x26242220, 0x2e2c2a28, 0x36343230, 0x3e3c3a38,
                                                   0x46444240, 0x4e4c4a48, 0x56545250, 0x5e5c5a58,
                                                   0x66646260, 0x6e6c6a68, 0x76747270, 0x7e7c7a78);

// 00000111 00000101 00000011 00000001, 00001111 00001101 00001011 00001001, 00010111 00010101 00010011 00010001, 00011111 00011101 00011011 00011001
// {7, 5, 3, 1},                        {15, 13, 11, 9},                     {23, 21, 19, 17},                    {31, 29, 27, 25}
// 00100111 00100101 00100011 00100001, 00101111 00101101 00101011 00101001, 00110111 00110101 00110011 00110001, 00111111 00111101 00111011 00111001
// {39, 37, 35, 33},                    {47, 45, 43, 41},                    {55, 53, 51, 49},                    {63, 61, 59, 57}
// 01000111 01000101 01000011 01000001, 01001111 01001101 01001011 01001001, 01010111 01010101 01010011 01010001, 01011111 01011101 01011011 01011001
// {71, 69, 67, 65},                    {79, 77, 75, 73},                    {87, 85, 83, 81},                    {95, 93, 91, 89}
// 01100111 01100101 01100011 01100001, 01101111 01101101 01101011 01101001, 01110111 01110101 01110011 01110001, 01111111 01111101 01111011 01111001
 // {103, 101, 99, 97},                 {111, 109, 107, 105},                {119, 117, 115, 113},                {127, 125, 123, 121}
            __m512i shuffle_hi = _mm512_setr_epi32(0x07050301, 0x0f0d0b09, 0x17151311, 0x1f1d1b19,
                                                   0x27252321, 0x2f2d2b29, 0x37353331, 0x3f3d3b39,
                                                   0x47454341, 0x4f4d4b49, 0x57555351, 0x5f5d5b59,
                                                   0x67656361, 0x6f6d6b69, 0x77757371, 0x7f7d7b79);
            
            // Move **lower** bytes from 16-bit counters, so bytes 0..31 of
            // results are from counter[i] and 32..63 from counter[i+1].
            __m512i lo_bytes = _mm512_permutex2var_epi8(counter[i], shuffle_lo, counter[i + 1]);

            // Likewise, move **higher** bytes.
            __m512i hi_bytes = _mm512_permutex2var_epi8(counter[i], shuffle_hi, counter[i + 1]);

            // Sum the lower bytes: now each 64-bit word holds sum of 8 bytes.
            __m512i sum_lo = _mm512_sad_epu8(lo_bytes, _mm512_setzero_si512());

            // Likewise sum the higher bytes.
            __m512i sum_hi = _mm512_sad_epu8(hi_bytes, _mm512_setzero_si512());

            // Calculate final sums --- the sum of higher bytes has to be multiplied by 256 (1 << 8)
            __m512i sum = _mm512_add_epi64(sum_lo, _mm512_slli_epi64(sum_hi, 8));

            // Since _mm512_extract* are slow. Instead we use a local buffer that is most likely cached.
            uint64_t buf64[8];
            _mm512_storeu_si512((__m512i*)buf64, _mm512_slli_epi32(sum, 4));

            flags[i + 0] += buf64[0] + buf64[1] + buf64[2] + buf64[3];
            flags[i + 1] += buf64[4] + buf64[5] + buf64[6] + buf64[7];
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v1);
    for (size_t i = 0; i < 32; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 1 * ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v2);
    for (size_t i = 0; i < 32; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    
    _mm512_storeu_si512((__m512i*)buffer, v4);
    for (size_t i = 0; i < 32; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v8);
    for (size_t i = 0; i < 32; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}